

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItemGraphVisitor.cxx
# Opt level: O2

void cmLinkItemGraphVisitor::GetDependencies
               (cmGeneratorTarget *target,string *config,DependencyMap *dependencies)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer pcVar3;
  cmGeneratorTarget *t;
  pointer ppcVar4;
  cmLinkImplementationLibraries *pcVar5;
  string *psVar6;
  mapped_type *pmVar7;
  cmLinkInterfaceLibraries *pcVar8;
  iterator iVar9;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *psVar10;
  _Base_ptr p_Var11;
  pointer this;
  pointer this_00;
  pointer ppcVar12;
  undefined1 local_158 [16];
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> objectLibraries;
  undefined1 local_128 [112];
  string local_b8;
  cmLinkItem objectItem;
  
  pcVar5 = cmGeneratorTarget::GetLinkImplementationLibraries(target,config,Link);
  if (pcVar5 != (cmLinkImplementationLibraries *)0x0) {
    pcVar2 = (pcVar5->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this = (pcVar5->Libraries).
                super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                super__Vector_impl_data._M_start; this != pcVar2; this = this + 1) {
      psVar6 = cmLinkItem::AsStr_abi_cxx11_(&this->super_cmLinkItem);
      local_128._0_4_ = LinkPrivate;
      cmLinkItem::cmLinkItem((cmLinkItem *)(local_128 + 8),&this->super_cmLinkItem);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
               ::operator[](dependencies,psVar6);
      std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::operator=
                (pmVar7,(type)local_128);
      cmLinkItem::~cmLinkItem((cmLinkItem *)(local_128 + 8));
    }
  }
  pcVar8 = cmGeneratorTarget::GetLinkInterfaceLibraries(target,config,target,Usage);
  if (pcVar8 != (cmLinkInterfaceLibraries *)0x0) {
    pcVar3 = (pcVar8->Libraries).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (this_00 = (pcVar8->Libraries).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
                   _M_impl.super__Vector_impl_data._M_start; this_00 != pcVar3;
        this_00 = this_00 + 1) {
      psVar6 = cmLinkItem::AsStr_abi_cxx11_(this_00);
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
              ::find(&dependencies->_M_t,psVar6);
      if ((_Rb_tree_header *)iVar9._M_node == &(dependencies->_M_t)._M_impl.super__Rb_tree_header) {
        local_128._0_4_ = LinkInterface;
        cmLinkItem::cmLinkItem((cmLinkItem *)(local_128 + 8),this_00);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
                 ::operator[](dependencies,psVar6);
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::operator=
                  (pmVar7,(type)local_128);
      }
      else {
        local_128._0_4_ = LinkPublic;
        cmLinkItem::cmLinkItem((cmLinkItem *)(local_128 + 8),this_00);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
                 ::operator[](dependencies,psVar6);
        std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::operator=
                  (pmVar7,(type)local_128);
      }
      cmLinkItem::~cmLinkItem((cmLinkItem *)(local_128 + 8));
    }
  }
  objectLibraries.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objectLibraries.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  objectLibraries.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetObjectLibrariesCMP0026(target,&objectLibraries);
  ppcVar4 = objectLibraries.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  p_Var1 = &(dependencies->_M_t)._M_impl.super__Rb_tree_header;
  for (ppcVar12 = objectLibraries.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar12 != ppcVar4;
      ppcVar12 = ppcVar12 + 1) {
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar12);
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
            ::find(&dependencies->_M_t,psVar6);
    if ((_Rb_tree_header *)iVar9._M_node == p_Var1) {
      t = *ppcVar12;
      cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_158);
      std::__cxx11::string::string((string *)&local_b8,(string *)&cmLinkItem::DEFAULT_abi_cxx11_);
      cmLinkItem::cmLinkItem(&objectItem,t,false,(cmListFileBacktrace *)local_158,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
      local_128._0_4_ = Object;
      cmLinkItem::cmLinkItem((cmLinkItem *)(local_128 + 8),&objectItem);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
               ::operator[](dependencies,psVar6);
      std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::operator=
                (pmVar7,(type)local_128);
      cmLinkItem::~cmLinkItem((cmLinkItem *)(local_128 + 8));
      cmLinkItem::~cmLinkItem(&objectItem);
    }
  }
  psVar10 = cmGeneratorTarget::GetUtilityItems(target);
  for (p_Var11 = (psVar10->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var11 != &(psVar10->_M_t)._M_impl.super__Rb_tree_header;
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
    psVar6 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)(p_Var11 + 1));
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
            ::find(&dependencies->_M_t,psVar6);
    if ((_Rb_tree_header *)iVar9._M_node == p_Var1) {
      local_128._0_4_ = Utility;
      cmLinkItem::cmLinkItem((cmLinkItem *)(local_128 + 8),(cmLinkItem *)(p_Var11 + 1));
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>_>_>_>
               ::operator[](dependencies,psVar6);
      std::pair<cmLinkItemGraphVisitor::DependencyType,_cmLinkItem>::operator=
                (pmVar7,(type)local_128);
      cmLinkItem::~cmLinkItem((cmLinkItem *)(local_128 + 8));
    }
  }
  std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
            (&objectLibraries.
              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>);
  return;
}

Assistant:

void cmLinkItemGraphVisitor::GetDependencies(cmGeneratorTarget const& target,
                                             std::string const& config,
                                             DependencyMap& dependencies)
{
  const auto* implementationLibraries = target.GetLinkImplementationLibraries(
    config, cmGeneratorTarget::LinkInterfaceFor::Link);
  if (implementationLibraries != nullptr) {
    for (auto const& lib : implementationLibraries->Libraries) {
      auto const& name = lib.AsStr();
      dependencies[name] = Dependency(DependencyType::LinkPrivate, lib);
    }
  }

  const auto* interfaceLibraries = target.GetLinkInterfaceLibraries(
    config, &target, cmGeneratorTarget::LinkInterfaceFor::Usage);
  if (interfaceLibraries != nullptr) {
    for (auto const& lib : interfaceLibraries->Libraries) {
      auto const& name = lib.AsStr();
      if (dependencies.find(name) != dependencies.cend()) {
        dependencies[name] = Dependency(DependencyType::LinkPublic, lib);
      } else {
        dependencies[name] = Dependency(DependencyType::LinkInterface, lib);
      }
    }
  }

  std::vector<cmGeneratorTarget*> objectLibraries;
  target.GetObjectLibrariesCMP0026(objectLibraries);
  for (auto const& lib : objectLibraries) {
    auto const& name = lib->GetName();
    if (dependencies.find(name) == dependencies.cend()) {
      auto objectItem = cmLinkItem(lib, false, lib->GetBacktrace());
      dependencies[name] = Dependency(DependencyType::Object, objectItem);
    }
  }

  auto const& utilityItems = target.GetUtilityItems();
  for (auto const& item : utilityItems) {
    auto const& name = item.AsStr();
    if (dependencies.find(name) == dependencies.cend()) {
      dependencies[name] = Dependency(DependencyType::Utility, item);
    }
  }
}